

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameters.cpp
# Opt level: O0

bool __thiscall
DIS::DeadReckoningParameters::operator==(DeadReckoningParameters *this,DeadReckoningParameters *rhs)

{
  bool bVar1;
  byte local_1a;
  bool local_19;
  uchar idx;
  bool ivarsEqual;
  DeadReckoningParameters *rhs_local;
  DeadReckoningParameters *this_local;
  
  local_19 = this->_deadReckoningAlgorithm == rhs->_deadReckoningAlgorithm;
  for (local_1a = 0; local_1a < 0xf; local_1a = local_1a + 1) {
    if (this->_parameters[local_1a] != rhs->_parameters[local_1a]) {
      local_19 = false;
    }
  }
  bVar1 = Vector3Float::operator==(&this->_entityLinearAcceleration,&rhs->_entityLinearAcceleration)
  ;
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = Vector3Float::operator==(&this->_entityAngularVelocity,&rhs->_entityAngularVelocity);
  if (!bVar1) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool DeadReckoningParameters::operator ==(const DeadReckoningParameters& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_deadReckoningAlgorithm == rhs._deadReckoningAlgorithm) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 15; idx++)
     {
          if(!(_parameters[idx] == rhs._parameters[idx]) ) ivarsEqual = false;
     }

     if( ! (_entityLinearAcceleration == rhs._entityLinearAcceleration) ) ivarsEqual = false;
     if( ! (_entityAngularVelocity == rhs._entityAngularVelocity) ) ivarsEqual = false;

    return ivarsEqual;
 }